

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall
CNode::ReceiveMsgBytes(CNode *this,Span<const_unsigned_char> msg_bytes,bool *complete)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  pointer pTVar4;
  ulong uVar5;
  mapped_type_conflict5 *pmVar6;
  pointer ppVar7;
  undefined1 *in_RCX;
  long in_RDI;
  long in_FS_OFFSET;
  iterator i;
  bool reject_message;
  duration<long,_std::ratio<1L,_1000000L>_> time;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock36;
  CNetMessage msg;
  CNetMessage *in_stack_fffffffffffffeb8;
  value_type *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  duration<long,_std::ratio<1L,_1L>_> in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  iterator in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  bool local_b1;
  byte local_81;
  rep local_80;
  undefined1 local_78 [32];
  undefined1 local_58 [44];
  uint local_2c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RCX = 0;
  local_80 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffeb8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffeff,
                      CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (char *)in_stack_fffffffffffffee0._M_node,
             (int)((ulong)in_stack_fffffffffffffed8._M_node >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffed8._M_node >> 0x18,0));
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000l>>
            ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffec0);
  std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::operator=
            ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffed0);
  sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)in_stack_fffffffffffffeb8);
  *(size_t *)(in_RDI + 0xf8) = sVar3 + *(long *)(in_RDI + 0xf8);
  do {
    sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)in_stack_fffffffffffffeb8);
    if (sVar3 == 0) {
      local_b1 = true;
LAB_00ff9b7b:
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffeb8);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_b1;
    }
    pTVar4 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                       ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                        in_stack_fffffffffffffeb8);
    uVar2 = (*pTVar4->_vptr_Transport[4])(pTVar4,local_78);
    if ((uVar2 & 1) == 0) {
      local_b1 = false;
      goto LAB_00ff9b7b;
    }
    pTVar4 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                       ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                        in_stack_fffffffffffffeb8);
    uVar2 = (*pTVar4->_vptr_Transport[3])();
    if ((uVar2 & 1) != 0) {
      local_81 = 0;
      pTVar4 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                         ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                          in_stack_fffffffffffffeb8);
      (*pTVar4->_vptr_Transport[5])(local_58,pTVar4,local_80,&local_81);
      if ((local_81 & 1) == 0) {
        in_stack_fffffffffffffee0 =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_fffffffffffffec0);
        bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffecf,
                                                  in_stack_fffffffffffffec8),
                                (_Self *)in_stack_fffffffffffffec0);
        if (bVar1) {
          in_stack_fffffffffffffed8 =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_fffffffffffffec0);
        bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffecf,
                                                  in_stack_fffffffffffffec8),
                                (_Self *)in_stack_fffffffffffffec0);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("i != mapRecvBytesPerMsgType.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                        ,0x2a9,"bool CNode::ReceiveMsgBytes(Span<const uint8_t>, bool &)");
        }
        uVar5 = (ulong)local_2c;
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                               *)in_stack_fffffffffffffeb8);
        ppVar7->second = ppVar7->second + uVar5;
        std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::push_back
                  ((list<CNetMessage,_std::allocator<CNetMessage>_> *)
                   CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec0);
        *in_RCX = 1;
      }
      else {
        uVar5 = (ulong)local_2c;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffee0._M_node,
                      (key_type *)in_stack_fffffffffffffed8._M_node);
        *pmVar6 = uVar5 + *pmVar6;
      }
      CNetMessage::~CNetMessage(in_stack_fffffffffffffeb8);
    }
  } while( true );
}

Assistant:

bool CNode::ReceiveMsgBytes(Span<const uint8_t> msg_bytes, bool& complete)
{
    complete = false;
    const auto time = GetTime<std::chrono::microseconds>();
    LOCK(cs_vRecv);
    m_last_recv = std::chrono::duration_cast<std::chrono::seconds>(time);
    nRecvBytes += msg_bytes.size();
    while (msg_bytes.size() > 0) {
        // absorb network data
        if (!m_transport->ReceivedBytes(msg_bytes)) {
            // Serious transport problem, disconnect from the peer.
            return false;
        }

        if (m_transport->ReceivedMessageComplete()) {
            // decompose a transport agnostic CNetMessage from the deserializer
            bool reject_message{false};
            CNetMessage msg = m_transport->GetReceivedMessage(time, reject_message);
            if (reject_message) {
                // Message deserialization failed. Drop the message but don't disconnect the peer.
                // store the size of the corrupt message
                mapRecvBytesPerMsgType.at(NET_MESSAGE_TYPE_OTHER) += msg.m_raw_message_size;
                continue;
            }

            // Store received bytes per message type.
            // To prevent a memory DOS, only allow known message types.
            auto i = mapRecvBytesPerMsgType.find(msg.m_type);
            if (i == mapRecvBytesPerMsgType.end()) {
                i = mapRecvBytesPerMsgType.find(NET_MESSAGE_TYPE_OTHER);
            }
            assert(i != mapRecvBytesPerMsgType.end());
            i->second += msg.m_raw_message_size;

            // push the message to the process queue,
            vRecvMsg.push_back(std::move(msg));

            complete = true;
        }
    }

    return true;
}